

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgviz.hpp
# Opt level: O0

imgviz * __thiscall imgviz::labelToBgr(imgviz *this,Mat *label,Mat *bgr,double alpha)

{
  int iVar1;
  Vec<unsigned_char,_3> *pVVar2;
  int *piVar3;
  int in_R8D;
  Vec<unsigned_char,_3> local_257;
  Vec<unsigned_char,_3> local_254;
  undefined2 local_251;
  uchar local_24f;
  Vec<unsigned_char,_3> local_24e;
  Vec<unsigned_char,_3> local_24b;
  int iStack_248;
  Vec3b label_color;
  Vec3b bgr_color;
  size_t i;
  size_t j;
  MatExpr local_230 [359];
  undefined1 local_c9;
  _InputArray local_c8;
  _InputArray local_b0;
  Mat local_88 [8];
  Mat bgr_;
  double alpha_local;
  Mat *bgr_local;
  Mat *label_local;
  Mat *label_bgr;
  
  cv::Mat::clone();
  iVar1 = cv::Mat::type(bgr);
  if (iVar1 == 0) {
    cv::_InputArray::_InputArray(&local_b0,bgr);
    cv::_OutputArray::_OutputArray((_OutputArray *)&local_c8,local_88);
    cv::cvtColor((cv *)&local_b0,&local_c8,(_OutputArray *)0x8,0,in_R8D);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&local_c8);
    cv::_InputArray::~_InputArray(&local_b0);
  }
  iVar1 = cv::Mat::type(label);
  if (iVar1 != 4) {
    __assert_fail("label.type() == CV_32SC1",
                  "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/include/imgviz.hpp"
                  ,0x100,"cv::Mat imgviz::labelToBgr(const cv::Mat, const cv::Mat, const double)");
  }
  iVar1 = cv::Mat::type(local_88);
  if (iVar1 != 0x10) {
    __assert_fail("bgr_.type() == CV_8UC3",
                  "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/include/imgviz.hpp"
                  ,0x101,"cv::Mat imgviz::labelToBgr(const cv::Mat, const cv::Mat, const double)");
  }
  local_c9 = 0;
  cv::MatSize::operator()((MatSize *)&j);
  cv::Mat::zeros(local_230,&j,0x10);
  cv::MatExpr::operator_cast_to_Mat((MatExpr *)this);
  cv::MatExpr::~MatExpr(local_230);
  for (i = 0; i < (ulong)(long)*(int *)(label + 8); i = i + 1) {
    for (_iStack_248 = 0; _iStack_248 < (ulong)(long)*(int *)(label + 0xc);
        _iStack_248 = _iStack_248 + 1) {
      pVVar2 = cv::Mat::at<cv::Vec<unsigned_char,3>>(local_88,(int)i,iStack_248);
      cv::Vec<unsigned_char,_3>::Vec(&local_24b,pVVar2);
      piVar3 = cv::Mat::at<int>(label,(int)i,iStack_248);
      getLabelColor((imgviz *)&local_24e,(uint8_t)*piVar3);
      cv::operator*((cv *)&local_254,alpha,&local_24e);
      cv::operator*((cv *)&local_257,1.0 - alpha,&local_24b);
      cv::operator+((cv *)&local_251,&local_254,&local_257);
      pVVar2 = cv::Mat::at<cv::Vec<unsigned_char,3>>((Mat *)this,(int)i,iStack_248);
      *(undefined2 *)(pVVar2->super_Matx<unsigned_char,_3,_1>).val = local_251;
      (pVVar2->super_Matx<unsigned_char,_3,_1>).val[2] = local_24f;
    }
  }
  local_c9 = 1;
  cv::Mat::~Mat(local_88);
  return this;
}

Assistant:

cv::Mat labelToBgr(const cv::Mat label, const cv::Mat bgr,
                   const double alpha = 0.5) {
  cv::Mat bgr_ = bgr.clone();
  if (bgr.type() == CV_8UC1) {
    cv::cvtColor(bgr, bgr_, cv::COLOR_GRAY2BGR);
  }

  assert(label.type() == CV_32SC1);
  assert(bgr_.type() == CV_8UC3);

  cv::Mat label_bgr = cv::Mat::zeros(label.size(), CV_8UC3);

  for (size_t j = 0; j < label.rows; j++) {
    for (size_t i = 0; i < label.cols; i++) {
      cv::Vec3b bgr_color = bgr_.at<cv::Vec3b>(j, i);
      cv::Vec3b label_color = getLabelColor(label.at<int32_t>(j, i) % 256);
      label_bgr.at<cv::Vec3b>(j, i) =
          alpha * label_color + (1 - alpha) * bgr_color;
    }
  }
  return label_bgr;
}